

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

sexp_conflict
sexp_get_env_cell(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,
                 sexp_conflict id,sexp_conflict createp)

{
  sexp_conflict psVar1;
  sexp_conflict psVar2;
  
  if ((((ulong)env & 3) == 0) && (env->tag == 0x17)) {
    psVar1 = (sexp_conflict)sexp_env_cell(ctx,env,id,0);
    if (psVar1 == (sexp_conflict)0x0) {
      if ((((ulong)id & 3) == 0) && (id->tag == 0x16)) {
        env = (sexp_conflict)(id->value).flonum;
        id = (id->value).type.slots;
      }
      psVar1 = (sexp_conflict)sexp_env_cell(ctx,env,id,0);
      if (createp != (sexp_conflict)0x3e && psVar1 == (sexp_conflict)0x0) {
        psVar1 = (sexp_conflict)sexp_env_cell_define(ctx,env,id,0x53e,0);
      }
    }
    psVar2 = (sexp_conflict)0x3e;
    if (psVar1 != (sexp_conflict)0x0) {
      psVar2 = psVar1;
    }
    return psVar2;
  }
  psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,0x17,env);
  return psVar1;
}

Assistant:

sexp sexp_get_env_cell (sexp ctx, sexp self, sexp_sint_t n, sexp env, sexp id, sexp createp) {
  sexp cell;
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, env);
  cell = sexp_env_cell(ctx, env, id, 0);
  if (! cell) {
    if (sexp_synclop(id)) {
      env = sexp_synclo_env(id);
      id = sexp_synclo_expr(id);
    }
    cell = sexp_env_cell(ctx, env, id, 0);
    if (!cell && sexp_truep(createp))
      cell = sexp_env_cell_define(ctx, env, id, SEXP_UNDEF, NULL);
  }
  return cell ? cell : SEXP_FALSE;
}